

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridAxisIrregular *this)

{
  pointer puVar1;
  ostream *poVar2;
  pointer puVar3;
  KStringStream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Grid Axis Irregular:",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n\tDomain Initial Xi:    ",0x18);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)(this->super_GridAxisRegular).m_f64DomainInitialXi);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tDomain Final Xi:      ",0x18);
  poVar2 = std::ostream::_M_insert<double>((double)(this->super_GridAxisRegular).m_f64DomainFinalXi)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tDomain Points Xi:     ",0x18);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tInterleaf Factor:     ",0x18);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tAxis Type:            ",0x18);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tNumber Of Points:     ",0x18);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tInitial Index:        ",0x18);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tCoordinate Scale Xi:  ",0x18);
  poVar2 = std::ostream::_M_insert<double>((double)this->m_f64CoordScaleXi);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tCoordinate Offset Xi: ",0x18);
  poVar2 = std::ostream::_M_insert<double>((double)this->m_f64CoordOffsetXi);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tXi Values:",0xc);
  puVar1 = (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_vXiValues).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n\t",2);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

KString GridAxisIrregular::GetAsString() const
{
    KStringStream ss;

    ss << "Grid Axis Irregular:"
       << "\n\tDomain Initial Xi:    " << m_f64DomainInitialXi
       << "\n\tDomain Final Xi:      " << m_f64DomainFinalXi
       << "\n\tDomain Points Xi:     " << m_ui16DomainPointsXi
       << "\n\tInterleaf Factor:     " << ( KUINT16 )m_ui8InterleafFactor
       << "\n\tAxis Type:            " << ( KUINT16 )m_ui8AxisType
       << "\n\tNumber Of Points:     " << m_ui16NumPoints
       << "\n\tInitial Index:        " << m_ui16InitialIndex
       << "\n\tCoordinate Scale Xi:  " << m_f64CoordScaleXi
       << "\n\tCoordinate Offset Xi: " << m_f64CoordOffsetXi
       << "\n\tXi Values:";

    vector<KUINT16>::const_iterator citr = m_vXiValues.begin();
    vector<KUINT16>::const_iterator citrEnd = m_vXiValues.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << "\n\t" << *citr;
    }

    ss << "\n";

    return ss.str();
}